

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O1

bool __thiscall State::moveDown(State *this,State *s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int **ppiVar4;
  State *this_00;
  int iVar5;
  
  iVar1 = (this->blank).height;
  iVar5 = this->height + -1;
  if (iVar1 != iVar5) {
    operator=(s,this);
    iVar2 = (s->blank).height;
    iVar3 = (s->blank).width;
    (s->blank).height = iVar2 + 1;
    ppiVar4 = s->tiles;
    ppiVar4[iVar2][iVar3] = ppiVar4[(long)iVar2 + 1][iVar3];
    ppiVar4[(s->blank).height][(s->blank).width] = 0;
    this_00 = (State *)operator_new(0x28);
    State(this_00,this);
    s->previous = this_00;
  }
  return iVar1 != iVar5;
}

Assistant:

bool State::moveDown(State &s) {
    if (blank.height == height - 1) {
        return false;
    }

    s = *this;
    s.moveX(+1);
    s.previous = new State(*this);
    return true;
}